

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

int __thiscall
Timer::
run_at<void(&)(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,int),std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,int&>
          (Timer *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *time_point,
          _func_void_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_int
          *f,time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             *args,int *args_1)

{
  int iVar1;
  atomic<int> *paVar2;
  undefined1 local_c8 [8];
  unique_lock<std::mutex> lock;
  IdState local_8c;
  undefined1 local_88 [8];
  TimerNode s;
  int *args_local_1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *args_local;
  _func_void_time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_int
  *f_local;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *time_point_local;
  Timer *this_local;
  
  s.tn_period.__r = (rep)args_1;
  TimerNode::TimerNode((TimerNode *)local_88);
  paVar2 = &this->tm_id;
  LOCK();
  s.tn_callback._M_invoker._4_4_ = (paVar2->super___atomic_base<int>)._M_i;
  (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_8c = Running;
  hash_map<int,_Timer::IdState>::emplace
            (&this->tm_id_state_map,(int *)((long)&s.tn_callback._M_invoker + 4),&local_8c);
  s.tn_id._0_1_ = 0;
  local_88 = (undefined1  [8])(time_point->__d).__r;
  std::
  bind<void(&)(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,int),std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,int&>
            ((type *)&lock._M_owns,f,args,(int *)s.tn_period.__r);
  std::function<void()>::operator=
            ((function<void()> *)&s,
             (_Bind<void_(*(std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int))(std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_int)>
              *)&lock._M_owns);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_c8,&this->tm_mutex);
  std::
  priority_queue<Timer::TimerNode,_std::vector<Timer::TimerNode,_std::allocator<Timer::TimerNode>_>,_std::less<Timer::TimerNode>_>
  ::push(&this->tm_queue,(value_type *)local_88);
  std::condition_variable::notify_all();
  iVar1 = s.tn_callback._M_invoker._4_4_;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
  TimerNode::~TimerNode((TimerNode *)local_88);
  return iVar1;
}

Assistant:

int run_at(const chrono::time_point<chrono::high_resolution_clock>& time_point, F&& f,
                            Args&&... args) {
        TimerNode s;
        s.tn_id = tm_id.fetch_add(1);
        tm_id_state_map.emplace(s.tn_id, IdState::Running);
        s.tn_is_period = false;
        s.tn_tm_point = time_point;
        // TODO: use lamda, tuple and apply of C++17 replacing bind
        s.tn_callback = bind(forward<F>(f), forward<Args>(args)...);
        unique_lock<mutex> lock(tm_mutex);
        tm_queue.push(s);
        tm_cond.notify_all();

        return s.tn_id;
    }